

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O2

void mzd_mul_v_s128_128(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  int iVar1;
  block_t *Ablock;
  long lVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  iVar1 = 2;
  auVar6 = ZEXT1664((undefined1  [16])0x0);
  auVar7 = ZEXT1664((undefined1  [16])0x0);
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    lVar2 = 0;
    while ((int)lVar2 != 0x400) {
      auVar4 = vpbroadcastq_avx512vl();
      auVar9 = vpsllq_avx(auVar4,0x3d);
      auVar8 = vpsllq_avx(auVar4,0x3e);
      auVar5 = vpbroadcastq_avx512vl();
      auVar9 = vpsraq_avx512vl(auVar9,0x3f);
      auVar5 = vpand_avx(auVar5,*(undefined1 (*) [16])((long)A->w64 + lVar2));
      auVar9 = vpand_avx(auVar9,*(undefined1 (*) [16])((long)A[1].w64 + lVar2));
      auVar8 = vpsraq_avx512vl(auVar8,0x3f);
      auVar8 = vpand_avx(auVar8,*(undefined1 (*) [16])((long)A->w64 + lVar2 + 0x10));
      auVar5 = vpternlogq_avx512vl(auVar7._0_16_,auVar5,auVar9,0x96);
      auVar7 = ZEXT1664(auVar5);
      auVar5 = vpsllq_avx(auVar4,0x3c);
      auVar5 = vpsraq_avx512vl(auVar5,0x3f);
      auVar5 = vpand_avx(auVar5,*(undefined1 (*) [16])((long)A[1].w64 + lVar2 + 0x10));
      lVar2 = lVar2 + 0x40;
      auVar5 = vpternlogq_avx512vl(auVar6._0_16_,auVar8,auVar5,0x96);
      auVar6 = ZEXT1664(auVar5);
    }
    A = A + 0x20;
  }
  *(undefined1 (*) [16])c->w64 = auVar7._0_16_ ^ auVar6._0_16_;
  return;
}

Assistant:

ATTR_TARGET_S128
void mzd_mul_v_s128_128(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word128 cval[4] = {mm128_zero, mm128_zero, mm128_zero, mm128_zero};
  for (unsigned int w = 2; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 4, idx >>= 4, Ablock += 2) {
      cval[0] = mm128_xor_mask(cval[0], mm128_load(&Ablock[0].w64[0]), mm128_compute_mask(idx, 0));
      cval[1] = mm128_xor_mask(cval[1], mm128_load(&Ablock[0].w64[2]), mm128_compute_mask(idx, 1));
      cval[0] = mm128_xor_mask(cval[0], mm128_load(&Ablock[1].w64[0]), mm128_compute_mask(idx, 2));
      cval[1] = mm128_xor_mask(cval[1], mm128_load(&Ablock[1].w64[2]), mm128_compute_mask(idx, 3));
    }
  }
  mm128_store(cblock->w64, mm128_xor(cval[0], cval[1]));
}